

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::BinaryExpressionSyntax::getChild(BinaryExpressionSyntax *this,size_t index)

{
  Token token;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  Info *in_stack_ffffffffffffffb0;
  nullptr_t in_stack_ffffffffffffffb8;
  
  switch(in_RDX) {
  case 0:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 0x18));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  case 1:
    token.info = in_stack_ffffffffffffffb0;
    token._0_8_ = in_stack_ffffffffffffffa8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x373796,token);
    break;
  case 2:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x30),in_stack_ffffffffffffffa8);
    break;
  case 3:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 0x68));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffffb8);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax BinaryExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return left.get();
        case 1: return operatorToken;
        case 2: return &attributes;
        case 3: return right.get();
        default: return nullptr;
    }
}